

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

double __thiscall
duckdb::Interpolator<false>::Extract<int,double>(Interpolator<false> *this,int *dest,Vector *result)

{
  undefined8 uVar1;
  Vector *in_RDI;
  undefined1 auVar2 [16];
  double hi;
  double lo;
  int *in_stack_ffffffffffffffd0;
  double local_28 [4];
  double local_8;
  
  if (*(long *)(in_RDI + 0x18) == *(long *)(in_RDI + 0x10)) {
    local_8 = CastInterpolation::Cast<int,double>(in_stack_ffffffffffffffd0,in_RDI);
  }
  else {
    local_28[0] = CastInterpolation::Cast<int,double>(in_stack_ffffffffffffffd0,in_RDI);
    CastInterpolation::Cast<int,double>(in_stack_ffffffffffffffd0,in_RDI);
    uVar1 = *(undefined8 *)(in_RDI + 0x10);
    auVar2._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar2._0_8_ = uVar1;
    auVar2._12_4_ = 0x45300000;
    local_8 = CastInterpolation::Interpolate<double>
                        (local_28,*(double *)(in_RDI + 8) -
                                  ((auVar2._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)),
                         (double *)&stack0xffffffffffffffd0);
  }
  return local_8;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}